

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QPoint>::emplace<QPoint_const&>
          (QPodArrayOps<QPoint> *this,qsizetype i,QPoint *args)

{
  QPoint **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QPoint QVar4;
  qsizetype qVar5;
  QPoint *pQVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QPoint>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QPoint>).size == i) &&
       (qVar5 = QArrayDataPointer<QPoint>::freeSpaceAtEnd(&this->super_QArrayDataPointer<QPoint>),
       qVar5 != 0)) {
      (this->super_QArrayDataPointer<QPoint>).ptr[(this->super_QArrayDataPointer<QPoint>).size] =
           *args;
    }
    else {
      if ((i != 0) ||
         (qVar5 = QArrayDataPointer<QPoint>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<QPoint>), qVar5 == 0))
      goto LAB_00116065;
      (this->super_QArrayDataPointer<QPoint>).ptr[-1] = *args;
      ppQVar1 = &(this->super_QArrayDataPointer<QPoint>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QPoint>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_00116065:
  QVar4 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QPoint>).size != 0);
  QArrayDataPointer<QPoint>::detachAndGrow
            (&this->super_QArrayDataPointer<QPoint>,where,1,(QPoint **)0x0,
             (QArrayDataPointer<QPoint> *)0x0);
  pQVar6 = createHole(this,where,i,1);
  *pQVar6 = QVar4;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }